

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EquivalentTypeSet.cpp
# Opt level: O2

void __thiscall Js::EquivalentTypeSet::SortAndRemoveDuplicates(EquivalentTypeSet *this)

{
  JITTypeHolderBase<Memory::Recycler> *pJVar1;
  JITType *ptr;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ushort uVar5;
  ulong uVar6;
  uint16 j;
  JITTypeHolderBase<void> local_58;
  long local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  local_38 = (ulong)this->count;
  local_50 = 1;
  uVar3 = 0x100000000;
  lVar4 = 8;
  do {
    uVar6 = local_38;
    local_48 = uVar3;
    local_40 = lVar4;
    if ((ushort)local_38 <= (ushort)local_50) {
      lVar4 = 8;
      uVar5 = 0;
      for (uVar3 = 1; uVar3 < uVar6; uVar3 = uVar3 + 1) {
        pJVar1 = (this->types).ptr;
        bVar2 = JITTypeHolderBase<Memory::Recycler>::operator!=
                          (pJVar1 + uVar5,
                           (JITTypeHolderBase<Memory::Recycler> *)((long)&(pJVar1->t).ptr + lVar4));
        if (bVar2) {
          pJVar1 = (this->types).ptr;
          uVar5 = uVar5 + 1;
          Memory::WriteBarrierPtr<JITType>::operator=
                    (&pJVar1[uVar5].t,(WriteBarrierPtr<JITType> *)((long)&(pJVar1->t).ptr + lVar4));
        }
        lVar4 = lVar4 + 8;
      }
      uVar5 = uVar5 + 1;
      this->count = uVar5;
      lVar4 = (ulong)uVar5 << 3;
      for (uVar3 = (ulong)uVar5; uVar3 < uVar6; uVar3 = uVar3 + 1) {
        JITTypeHolderBase<void>::JITTypeHolderBase(&local_58,(JITType *)0x0);
        Memory::WriteBarrierPtr<JITType>::WriteBarrierSet
                  ((WriteBarrierPtr<JITType> *)((long)&(((this->types).ptr)->t).ptr + lVar4),
                   local_58.t);
        lVar4 = lVar4 + 8;
      }
      this->sortedAndDuplicatesRemoved = true;
      return;
    }
    for (; lVar4 != 0; lVar4 = lVar4 + -8) {
      pJVar1 = (this->types).ptr;
      uVar6 = uVar3 & 0xffffffff;
      bVar2 = JITTypeHolderBase<Memory::Recycler>::operator>
                        (pJVar1 + uVar6,
                         (JITTypeHolderBase<Memory::Recycler> *)((long)&(pJVar1->t).ptr + lVar4));
      if (!bVar2) break;
      pJVar1 = (this->types).ptr;
      ptr = *(JITType **)((long)&(pJVar1->t).ptr + lVar4);
      Memory::WriteBarrierPtr<JITType>::operator=
                ((WriteBarrierPtr<JITType> *)((long)&(pJVar1->t).ptr + lVar4),&pJVar1[uVar6].t);
      Memory::WriteBarrierPtr<JITType>::WriteBarrierSet(&(this->types).ptr[uVar6].t,ptr);
      uVar3 = uVar3 - 1;
    }
    local_50 = local_50 + 1;
    uVar3 = local_48 + 1;
    lVar4 = local_40 + 8;
  } while( true );
}

Assistant:

void EquivalentTypeSet::SortAndRemoveDuplicates()
{
    uint16 oldCount = this->count;
    uint16 i;

    // sorting
    for (i = 1; i < oldCount; i++)
    {
        uint16 j = i;
        while (j > 0 && (this->types[j - 1] > this->types[j]))
        {
            JITTypeHolder tmp = this->types[j];
            this->types[j] = this->types[j - 1];
            this->types[j - 1] = tmp;
            j--;
        }
    }

    // removing duplicate types from the sorted set
    i = 0;
    for (uint16 j = 1; j < oldCount; j++)
    {
        if (this->types[i] != this->types[j])
        {
            this->types[++i] = this->types[j];
        }
    }
    this->count = ++i;
    for (i; i < oldCount; i++)
    {
        this->types[i] = JITTypeHolder(nullptr);
    }

    this->sortedAndDuplicatesRemoved = true;
}